

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_downward.h
# Opt level: O0

void __thiscall
flatbuffers::vector_downward<unsigned_int>::clear_buffer(vector_downward<unsigned_int> *this)

{
  vector_downward<unsigned_int> *this_local;
  
  if (this->buf_ != (uint8_t *)0x0) {
    Deallocate(this->allocator_,this->buf_,this->reserved_);
  }
  this->buf_ = (uint8_t *)0x0;
  return;
}

Assistant:

void clear_buffer() {
    if (buf_) Deallocate(allocator_, buf_, reserved_);
    buf_ = nullptr;
  }